

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O0

void invalidate_attrs(tgestate_t *state,uint8_t *start,int width,int height)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  zxbox_t dirty;
  int y;
  int x;
  ptrdiff_t offset;
  uint8_t *base;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  ulong local_28;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0x18) + 0x1830;
  local_28 = in_RSI - local_20;
  local_40 = (int)((local_28 & 0x1f) << 3);
  local_3c = (0x18 - ((int)local_28 >> 5)) * 8 - in_ECX;
  local_38 = local_40 + in_EDX;
  local_34 = local_3c + in_ECX;
  local_30 = local_3c;
  local_2c = local_40;
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(*(undefined8 *)(in_RDI + 0x18),&local_40);
  return;
}

Assistant:

void invalidate_attrs(tgestate_t *state,
                      uint8_t    *start,
                      int         width,
                      int         height)
{
  uint8_t   *base = &state->speccy->screen.pixels[SCREEN_BITMAP_LENGTH];
  ptrdiff_t  offset;
  int        x,y;
  zxbox_t    dirty;

  offset = start - base;

  /* Convert attribute offset to cartesian for the interface. */
  x = (offset & 31) * 8;
  y = (int) offset >> 5;
  y = 23 - y;     /* flip */
  y = y + 1;      /* inclusive lower bound becomes exclusive upper */
  y = y * 8;      /* scale */
  y = y - height; /* get min-y */

  dirty.x0 = x;
  dirty.y0 = y;
  dirty.x1 = x + width;
  dirty.y1 = y + height;
  state->speccy->draw(state->speccy, &dirty);
}